

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  Balk balk;
  Parser local_ba;
  allocator<char> local_b9;
  string local_b8;
  Balk local_98;
  
  if (argc == 3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,argv[1],&local_b9);
    Parser::get_balk_from_file(&local_98,&local_ba,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    Balk::solve_balk(&local_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,argv[2],(allocator<char> *)&local_ba);
    Balk::save_result(&local_98,&local_b8,1000);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    Balk::~Balk(&local_98);
    iVar1 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10c130);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," \"<input_file_name>\" \"<output_folder_name>\"",0x2b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    if (argc != 3) {
        std::cout << "Usage: " << argv[0] <<" \"<input_file_name>\" \"<output_folder_name>\"" << std::endl;
        return -1;
    }
    try
    {
        Balk balk = Parser().get_balk_from_file(argv[1]);
        balk.solve_balk();
        balk.save_result(argv[2]);
    }
    catch (const ParseError &e)
    {
        std::cout << e.what() << std::endl;
        return -1;
    }
    return 0;
}